

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_setRoot(char *archive,char *subdir)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *dst;
  char *ptr;
  size_t len;
  DirHandle *i;
  char *subdir_local;
  char *archive_local;
  
  if (archive == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    archive_local._4_4_ = 0;
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    for (len = (size_t)searchPath; len != 0; len = *(size_t *)(len + 0x30)) {
      if ((*(long *)(len + 8) != 0) && (iVar1 = strcmp(archive,*(char **)(len + 8)), iVar1 == 0)) {
        if ((subdir == (char *)0x0) || (iVar1 = strcmp(subdir,"/"), iVar1 == 0)) {
          if (*(long *)(len + 0x18) != 0) {
            (*__PHYSFS_AllocatorHooks.Free)(*(void **)(len + 0x18));
          }
          *(undefined8 *)(len + 0x18) = 0;
          *(undefined8 *)(len + 0x20) = 0;
        }
        else {
          sVar2 = strlen(subdir);
          uVar3 = sVar2 + 1;
          dst = (char *)(*__PHYSFS_AllocatorHooks.Malloc)(uVar3);
          if (dst == (char *)0x0) {
            PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            __PHYSFS_platformReleaseMutex(stateLock);
            return 0;
          }
          iVar1 = sanitizePlatformIndependentPath(subdir,dst);
          if (iVar1 == 0) {
            (*__PHYSFS_AllocatorHooks.Free)(dst);
            __PHYSFS_platformReleaseMutex(stateLock);
            return 0;
          }
          if (*(long *)(len + 0x18) != 0) {
            (*__PHYSFS_AllocatorHooks.Free)(*(void **)(len + 0x18));
          }
          *(char **)(len + 0x18) = dst;
          *(ulong *)(len + 0x20) = uVar3;
          if (longest_root < uVar3) {
            longest_root = uVar3;
          }
        }
        break;
      }
    }
    __PHYSFS_platformReleaseMutex(stateLock);
    archive_local._4_4_ = 1;
  }
  return archive_local._4_4_;
}

Assistant:

int PHYSFS_setRoot(const char *archive, const char *subdir)
{
    DirHandle *i;

    BAIL_IF(!archive, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    for (i = searchPath; i != NULL; i = i->next)
    {
        if ((i->dirName != NULL) && (strcmp(archive, i->dirName) == 0))
        {
            if (!subdir || (strcmp(subdir, "/") == 0))
            {
                if (i->root)
                    allocator.Free(i->root);
                i->root = NULL;
                i->rootlen = 0;
            } /* if */
            else
            {
                const size_t len = strlen(subdir) + 1;
                char *ptr = (char *) allocator.Malloc(len);
                BAIL_IF_MUTEX(!ptr, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
                if (!sanitizePlatformIndependentPath(subdir, ptr))
                {
                    allocator.Free(ptr);
                    BAIL_MUTEX_ERRPASS(stateLock, 0);
                } /* if */

                if (i->root)
                    allocator.Free(i->root);
                i->root = ptr;
                i->rootlen = len;

                if (longest_root < len)
                    longest_root = len;
            } /* else */

            break;
        } /* if */
    } /* for */

    __PHYSFS_platformReleaseMutex(stateLock);
    return 1;
}